

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzblockdiag.cpp
# Opt level: O0

void __thiscall
TPZBlockDiagonal<float>::TPZBlockDiagonal(TPZBlockDiagonal<float> *this,TPZVec<int> *blocksize)

{
  TPZBlockDiagonal<float> *in_RSI;
  TPZRegisterClassId *in_RDI;
  TPZVec<float> *this_00;
  TPZMatrix<float> *in_stack_ffffffffffffffc0;
  TPZVec<int> *blocksize_00;
  
  blocksize_00 = (TPZVec<int> *)0x0;
  TPZRegisterClassId::TPZRegisterClassId<TPZBlockDiagonal<float>>(in_RDI,0x21);
  *(undefined8 *)(in_RDI + 10) = 0;
  *(undefined8 *)(in_RDI + 0x12) = 0;
  *(undefined8 *)in_RDI = 0;
  *(undefined8 *)(in_RDI + 8) = 0;
  TPZMatrix<float>::TPZMatrix(in_stack_ffffffffffffffc0,(void **)in_RDI);
  *(undefined ***)in_RDI = &PTR__TPZBlockDiagonal_023f0a60;
  this_00 = (TPZVec<float> *)(in_RDI + 0x20);
  TPZVec<float>::TPZVec(this_00);
  TPZVec<long>::TPZVec((TPZVec<long> *)this_00,(int64_t)in_RDI,(long *)(in_RDI + 0x40));
  TPZVec<int>::TPZVec((TPZVec<int> *)(in_RDI + 0x60));
  Initialize(in_RSI,blocksize_00);
  return;
}

Assistant:

TPZBlockDiagonal<TVar>::TPZBlockDiagonal(const TPZVec<int> &blocksize)
: TPZRegisterClassId(&TPZBlockDiagonal::ClassId),
TPZMatrix<TVar>(), fStorage(), fBlockPos(1,0),fBlockSize()
{
	Initialize(blocksize);
}